

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O1

void __thiscall
IRT::CCallSimplifierVisitor::Visit
          (CCallSimplifierVisitor *this,CJumpConditionalStatement *statement)

{
  CStatement *pCVar1;
  TLogicOperator _operation;
  CExpression *pCVar2;
  CExpression *pCVar3;
  CJumpConditionalStatement *this_00;
  CLabelStatement local_60;
  _Alloc_hider local_38;
  
  pCVar2 = CJumpConditionalStatement::LeftOperand(statement);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  pCVar2 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar3 = CJumpConditionalStatement::RightOperand(statement);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  pCVar3 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  this_00 = (CJumpConditionalStatement *)operator_new(0x30);
  _operation = CJumpConditionalStatement::Operation(statement);
  local_60.label.label._M_string_length = (size_type)pCVar3;
  local_60.label.label.field_2._M_allocated_capacity = (size_type)pCVar2;
  CJumpConditionalStatement::TrueLabel(statement);
  CLabelStatement::CastCopy(&local_60);
  local_60.label.label._M_dataplus._M_p =
       (pointer)local_60.super_CStatement.super_IStatement.super_INode._vptr_INode;
  local_60.super_CStatement.super_IStatement.super_INode._vptr_INode = (IStatement)(INode)0x0;
  CJumpConditionalStatement::FalseLabel(statement);
  CLabelStatement::CastCopy((CLabelStatement *)((long)&local_60.label.label.field_2 + 8));
  local_38._M_p = (pointer)local_60.label.label.field_2._8_8_;
  local_60.label.label.field_2._8_8_ = (long *)0x0;
  CJumpConditionalStatement::CJumpConditionalStatement
            (this_00,_operation,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_60.label.label.field_2._M_allocated_capacity,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_60.label.label._M_string_length,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_60.label,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_38);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)this_00;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if ((long *)local_38._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_38._M_p + 0x10))();
  }
  local_38._M_p = (pointer)0x0;
  if ((long *)local_60.label.label.field_2._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_60.label.label.field_2._8_8_ + 0x10))();
  }
  if ((_func_int **)local_60.label.label._M_dataplus._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_60.label.label._M_dataplus._M_p + 0x10))();
  }
  local_60.label.label._M_dataplus._M_p = (pointer)0x0;
  if (local_60.super_CStatement.super_IStatement.super_INode._vptr_INode != (INode)0x0) {
    (**(code **)(*(_func_int **)local_60.super_CStatement.super_IStatement.super_INode._vptr_INode +
                0x10))();
  }
  if ((CExpression *)local_60.label.label._M_string_length != (CExpression *)0x0) {
    (*(((IExpression *)local_60.label.label._M_string_length)->super_INode)._vptr_INode[2])();
  }
  local_60.label.label._M_string_length = 0;
  if ((CExpression *)local_60.label.label.field_2._M_allocated_capacity != (CExpression *)0x0) {
    (**(code **)((long)*(IExpression *)local_60.label.label.field_2._M_allocated_capacity + 0x10))()
    ;
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CJumpConditionalStatement &statement) {
    statement.LeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    statement.RightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CJumpConditionalStatement(
                            statement.Operation(),
                            std::move(left),
                            std::move(right),
                            std::move(statement.TrueLabel()->CastCopy()),
                            std::move(statement.FalseLabel()->CastCopy())
                    )
            )
    );
}